

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O0

uint64_t farmhashuo::Hash64WithSeeds(char *s,size_t len,uint64_t seed0,uint64_t seed1)

{
  uint64_t uVar1;
  long lVar2;
  ulong val;
  char *a;
  char *s_00;
  long in_RCX;
  long in_RDX;
  ulong in_RSI;
  char *in_RDI;
  uint64_t a7;
  uint64_t a6;
  uint64_t a5;
  uint64_t a4;
  uint64_t a3;
  uint64_t a2;
  uint64_t a1;
  uint64_t a0;
  char *last64;
  char *end;
  uint64_t mul;
  uint64_t u;
  pair<unsigned_long,_unsigned_long> w;
  pair<unsigned_long,_unsigned_long> v;
  uint64_t z;
  uint64_t y;
  uint64_t x;
  unsigned_long *in_stack_fffffffffffffed8;
  int iVar3;
  unsigned_long *in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffee8;
  unsigned_long uVar4;
  char *in_stack_fffffffffffffef0;
  uint64_t in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  pair<unsigned_long,_unsigned_long> local_f0;
  pair<unsigned_long,_unsigned_long> local_e0;
  uint64_t local_d0;
  uint64_t local_c8;
  uint64_t local_c0;
  uint64_t local_b8;
  uint64_t local_b0;
  uint64_t local_a8;
  uint64_t local_a0;
  uint64_t local_98;
  char *local_90;
  char *local_88;
  uint64_t local_80;
  ulong local_78;
  undefined4 local_70;
  undefined4 local_6c;
  pair<int,_int> local_68;
  pair<unsigned_long,_unsigned_long> local_60;
  pair<unsigned_long,_unsigned_long> local_50;
  unsigned_long local_40;
  unsigned_long local_38;
  ulong local_30;
  ulong local_18;
  char *local_10;
  uint64_t local_8;
  
  if (in_RSI < 0x41) {
    local_8 = farmhashna::Hash64WithSeeds
                        (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                         (uint64_t)in_stack_fffffffffffffee0,(uint64_t)in_stack_fffffffffffffed8);
  }
  else {
    local_38 = in_RCX * -0x651e95c4d06fbfb1 + 0x71;
    local_30 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    uVar1 = farmhashna::ShiftMix(local_38 * -0x651e95c4d06fbfb1);
    local_40 = uVar1 * -0x651e95c4d06fbfb1;
    local_50 = std::make_pair<unsigned_long&,unsigned_long&>
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    local_6c = 0;
    local_70 = 0;
    local_68 = std::make_pair<int,int>((int *)in_stack_fffffffffffffed8,(int *)0x2ab481);
    std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_60,&local_68);
    local_78 = local_30 - local_40;
    local_30 = local_30 * -0x651e95c4d06fbfb1;
    local_80 = (local_78 & 0x82) + 0x9ae16a3b2f90404f;
    local_88 = local_10 + (local_18 - 1 & 0xffffffffffffffc0);
    local_90 = local_88 + ((local_18 - 1 & 0x3f) - 0x3f);
    do {
      local_98 = util::Fetch64(local_10);
      local_a0 = util::Fetch64(local_10 + 8);
      local_a8 = util::Fetch64(local_10 + 0x10);
      local_b0 = util::Fetch64(local_10 + 0x18);
      local_b8 = util::Fetch64(local_10 + 0x20);
      local_c0 = util::Fetch64(local_10 + 0x28);
      local_c8 = util::Fetch64(local_10 + 0x30);
      local_d0 = util::Fetch64(local_10 + 0x38);
      local_30 = local_98 + local_a0 + local_30;
      local_38 = local_a8 + local_38;
      local_40 = local_b0 + local_40;
      local_50.second = local_c0 + local_a0 + local_50.second;
      local_60.first = local_c8 + local_60.first;
      local_60.second = local_d0 + local_60.second;
      local_50.first = local_b8 + local_50.first;
      uVar1 = util::Rotate64((uint64_t)in_stack_fffffffffffffee0,
                             (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      local_30 = uVar1 * 9;
      local_38 = util::Rotate64((uint64_t)in_stack_fffffffffffffee0,
                                (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      local_40 = local_80 * local_40;
      local_50.first =
           util::Rotate64((uint64_t)in_stack_fffffffffffffee0,
                          (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      uVar1 = util::Rotate64((uint64_t)in_stack_fffffffffffffee0,
                             (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      local_60.first = (local_30 ^ local_60.first) * 9;
      local_50.second = uVar1;
      uVar1 = util::Rotate64((uint64_t)in_stack_fffffffffffffee0,
                             (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      lVar2 = local_60.second + uVar1;
      local_60.second = lVar2 + local_60.second;
      local_40 = lVar2 * 9;
      std::swap<unsigned_long>(&local_78,&local_38);
      local_40 = local_98 + local_c8 + local_40;
      lVar2 = local_a0 + local_30;
      local_38 = local_a8 + local_50.first + local_d0 + local_38;
      local_50.second = local_b8 + local_60.first + local_b0 + local_50.second;
      local_50.first = (lVar2 - local_38) + local_a8 + local_50.first;
      local_60.first = local_50.second + local_b8 + local_60.first;
      local_60.second = (lVar2 - local_38) + local_c0 + local_c8 + local_60.second;
      local_30 = local_60.second + lVar2;
      local_60.second =
           util::Rotate64((uint64_t)in_stack_fffffffffffffee0,
                          (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      std::swap<unsigned_long>(&local_78,&local_40);
      iVar3 = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
      local_10 = local_10 + 0x40;
    } while (local_10 != local_88);
    local_10 = local_90;
    local_78 = local_78 * 9;
    uVar1 = util::Rotate64((uint64_t)in_stack_fffffffffffffee0,iVar3);
    local_50.second = uVar1;
    local_50.first = util::Rotate64((uint64_t)in_stack_fffffffffffffee0,iVar3);
    local_60.first = (local_18 - 1 & 0x3f) + local_60.first;
    local_78 = local_38 + local_78;
    local_38 = local_78 + local_38;
    iVar3 = (int)((local_38 - local_30) + local_50.first >> 0x20);
    util::Fetch64(local_10 + 8);
    uVar1 = util::Rotate64((uint64_t)in_stack_fffffffffffffee0,iVar3);
    local_30 = uVar1 * local_80;
    val = local_38 ^ local_50.second;
    util::Fetch64(local_10 + 0x30);
    local_38 = util::Rotate64(val,iVar3);
    local_38 = local_38 * local_80;
    local_30 = local_60.second * 9 ^ local_30;
    uVar4 = local_50.first;
    uVar1 = util::Fetch64(local_10 + 0x28);
    local_38 = uVar4 + uVar1 + local_38;
    uVar1 = util::Rotate64(val,iVar3);
    iVar3 = (int)(uVar4 >> 0x20);
    local_40 = uVar1 * local_80;
    local_e0 = farmhashna::WeakHashLen32WithSeeds
                         (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                          (uint64_t)in_stack_fffffffffffffef0);
    std::pair<unsigned_long,_unsigned_long>::operator=(&local_50,&local_e0);
    a = local_10 + 0x20;
    s_00 = (char *)(local_40 + local_60.second);
    uVar4 = local_38;
    util::Fetch64(local_10 + 0x10);
    local_f0 = farmhashna::WeakHashLen32WithSeeds(s_00,(uint64_t)a,uVar4);
    std::pair<unsigned_long,_unsigned_long>::operator=(&local_60,&local_f0);
    farmhashna::HashLen16(local_50.first + local_30,local_60.first ^ local_38,local_80);
    H((uint64_t)s_00,(uint64_t)a,uVar4,iVar3);
    local_8 = H((uint64_t)s_00,(uint64_t)a,uVar4,iVar3);
  }
  return local_8;
}

Assistant:

uint64_t Hash64WithSeeds(const char *s, size_t len,
                         uint64_t seed0, uint64_t seed1) {
  if (len <= 64) {
    return farmhashna::Hash64WithSeeds(s, len, seed0, seed1);
  }

  // For strings over 64 bytes we loop.  Internal state consists of
  // 64 bytes: u, v, w, x, y, and z.
  uint64_t x = seed0;
  uint64_t y = seed1 * k2 + 113;
  uint64_t z = farmhashna::ShiftMix(y * k2) * k2;
  pair<uint64_t, uint64_t> v = make_pair(seed0, seed1);
  pair<uint64_t, uint64_t> w = make_pair(0, 0);
  uint64_t u = x - z;
  x *= k2;
  uint64_t mul = k2 + (u & 0x82);

  // Set end so that after the loop we have 1 to 64 bytes left to process.
  const char* end = s + ((len - 1) / 64) * 64;
  const char* last64 = end + ((len - 1) & 63) - 63;
  assert(s + len - 64 == last64);
  do {
    uint64_t a0 = Fetch(s);
    uint64_t a1 = Fetch(s + 8);
    uint64_t a2 = Fetch(s + 16);
    uint64_t a3 = Fetch(s + 24);
    uint64_t a4 = Fetch(s + 32);
    uint64_t a5 = Fetch(s + 40);
    uint64_t a6 = Fetch(s + 48);
    uint64_t a7 = Fetch(s + 56);
    x += a0 + a1;
    y += a2;
    z += a3;
    v.first += a4;
    v.second += a5 + a1;
    w.first += a6;
    w.second += a7;

    x = Rotate(x, 26);
    x *= 9;
    y = Rotate(y, 29);
    z *= mul;
    v.first = Rotate(v.first, 33);
    v.second = Rotate(v.second, 30);
    w.first ^= x;
    w.first *= 9;
    z = Rotate(z, 32);
    z += w.second;
    w.second += z;
    z *= 9;
    std::swap(u, y);

    z += a0 + a6;
    v.first += a2;
    v.second += a3;
    w.first += a4;
    w.second += a5 + a6;
    x += a1;
    y += a7;

    y += v.first;
    v.first += x - y;
    v.second += w.first;
    w.first += v.second;
    w.second += x - y;
    x += w.second;
    w.second = Rotate(w.second, 34);
    std::swap(u, z);
    s += 64;
  } while (s != end);
  // Make s point to the last 64 bytes of input.
  s = last64;
  u *= 9;
  v.second = Rotate(v.second, 28);
  v.first = Rotate(v.first, 20);
  w.first += ((len - 1) & 63);
  u += y;
  y += u;
  x = Rotate(y - x + v.first + Fetch(s + 8), 37) * mul;
  y = Rotate(y ^ v.second ^ Fetch(s + 48), 42) * mul;
  x ^= w.second * 9;
  y += v.first + Fetch(s + 40);
  z = Rotate(z + w.first, 33) * mul;
  v = farmhashna::WeakHashLen32WithSeeds(s, v.second * mul, x + w.first);
  w = farmhashna::WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch(s + 16));
  return H(farmhashna::HashLen16(v.first + x, w.first ^ y, mul) + z - u,
           H(v.second + y, w.second + z, k2, 30) ^ x,
           k2,
           31);
}